

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

JointObservation * __thiscall
MADPComponentDiscreteObservations::GetJointObservation
          (MADPComponentDiscreteObservations *this,Index i)

{
  pointer ppJVar1;
  ostream *poVar2;
  E *pEVar3;
  stringstream ss;
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_188,"MADPComponentDiscreteObservations::GetJointObservation(");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,") - Error: not initialized. ");
    std::endl<char,std::char_traits<char>>(poVar2);
    pEVar3 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar3,&ss);
    __cxa_throw(pEVar3,&E::typeinfo,E::~E);
  }
  if (this->_m_cachedAllJointObservations != false) {
    ppJVar1 = (this->_m_jointObservationVec).
              super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)i <
        (ulong)((long)(this->_m_jointObservationVec).
                      super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3)) {
      return &ppJVar1[i]->super_JointObservation;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_188,
                             "WARNING MADPComponentDiscreteObservations::GetJointObservation(Index i) index out of bounds (i="
                            );
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
    pEVar3 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar3,&ss);
    __cxa_throw(pEVar3,&E::typeinfo,E::~E);
  }
  pEVar3 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar3,
       "MADPComponentDiscreteObservations::GetJointObservationDiscrete: joint observations have not been created"
      );
  __cxa_throw(pEVar3,&E::typeinfo,E::~E);
}

Assistant:

const JointObservation* MADPComponentDiscreteObservations::GetJointObservation(Index i) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteObservations::GetJointObservation("<< 
        i<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(!_m_cachedAllJointObservations)
    {
        throw E("MADPComponentDiscreteObservations::GetJointObservationDiscrete: joint observations have not been created");
    }
    if(i < _m_jointObservationVec.size() )
        return( (const JointObservation*) _m_jointObservationVec[i] );
    //else        
    stringstream ss;
    ss << "WARNING MADPComponentDiscreteObservations::GetJointObservation(Index i) index out of bounds (i="<< i <<")"<<endl;
    throw E(ss);
}